

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O0

void uv__stream_init(uv_loop_t *loop,uv_stream_t *stream,uv_handle_type type)

{
  undefined8 uVar1;
  undefined4 in_EDX;
  uv__io_t *in_RSI;
  char *in_RDI;
  int err;
  int in_stack_ffffffffffffffe8;
  
  in_RSI->pending_queue[1] = in_RDI;
  *(undefined4 *)in_RSI->watcher_queue = in_EDX;
  in_RSI->fd = 0x2000;
  in_RSI->watcher_queue[1] = in_RDI + 0x10;
  uVar1 = *(undefined8 *)(in_RDI + 0x18);
  in_RSI->pevents = (int)uVar1;
  in_RSI->events = (int)((ulong)uVar1 >> 0x20);
  **(long **)&in_RSI->pevents = (long)(in_RSI->watcher_queue + 1);
  *(void ***)(in_RDI + 0x18) = in_RSI->watcher_queue + 1;
  in_RSI[1].cb = (uv__io_cb)0x0;
  in_RSI[1].watcher_queue[0] = (void *)0x0;
  in_RSI[1].watcher_queue[1] = (void *)0x0;
  in_RSI[1].pending_queue[1] = (void *)0x0;
  in_RSI->cb = (uv__io_cb)0x0;
  in_RSI[3].watcher_queue[1] = (void *)0x0;
  in_RSI[1].pevents = 0;
  in_RSI[1].events = 0;
  *(undefined8 *)&in_RSI[1].fd = 0;
  in_RSI[3].events = 0xffffffff;
  in_RSI[3].pevents = 0;
  in_RSI[3].cb = (uv__io_cb)(in_RSI + 3);
  in_RSI[3].pending_queue[0] = in_RSI + 3;
  in_RSI[3].pending_queue[1] = in_RSI[3].pending_queue + 1;
  in_RSI[3].watcher_queue[0] = in_RSI[3].pending_queue + 1;
  in_RSI[1].pending_queue[0] = (void *)0x0;
  if ((*(int *)(in_RDI + 0x278) == -1) &&
     (in_stack_ffffffffffffffe8 = uv__open_cloexec(in_RDI,(int)((ulong)in_RSI >> 0x20)),
     -1 < in_stack_ffffffffffffffe8)) {
    *(int *)(in_RDI + 0x278) = in_stack_ffffffffffffffe8;
  }
  uv__io_init(in_RSI,(uv__io_cb)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),0);
  return;
}

Assistant:

void uv__stream_init(uv_loop_t* loop,
                     uv_stream_t* stream,
                     uv_handle_type type) {
  int err;

  uv__handle_init(loop, (uv_handle_t*)stream, type);
  stream->read_cb = NULL;
  stream->read2_cb = NULL;
  stream->alloc_cb = NULL;
  stream->close_cb = NULL;
  stream->connection_cb = NULL;
  stream->connect_req = NULL;
  stream->shutdown_req = NULL;
  stream->accepted_fd = -1;
  stream->delayed_error = 0;
  QUEUE_INIT(&stream->write_queue);
  QUEUE_INIT(&stream->write_completed_queue);
  stream->write_queue_size = 0;

  if (loop->emfile_fd == -1) {
    err = uv__open_cloexec("/", O_RDONLY);
    if (err >= 0)
      loop->emfile_fd = err;
  }

#if defined(__APPLE__)
  stream->select = NULL;
#endif /* defined(__APPLE_) */

  uv__io_init(&stream->io_watcher, uv__stream_io, -1);
}